

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeExtract.cpp
# Opt level: O0

void __thiscall
cali::AttributeExtract::AttributeExtract(AttributeExtract *this,SnapshotProcessFn *snap_fn)

{
  AttributeExtractImpl *this_00;
  function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
  local_38;
  SnapshotProcessFn *local_18;
  SnapshotProcessFn *snap_fn_local;
  AttributeExtract *this_local;
  
  local_18 = snap_fn;
  snap_fn_local = (SnapshotProcessFn *)this;
  this_00 = (AttributeExtractImpl *)operator_new(0x28);
  std::
  function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
  ::function(&local_38,snap_fn);
  AttributeExtractImpl::AttributeExtractImpl(this_00,&local_38);
  std::shared_ptr<cali::AttributeExtract::AttributeExtractImpl>::
  shared_ptr<cali::AttributeExtract::AttributeExtractImpl,void>(&this->mP,this_00);
  std::
  function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
  ::~function(&local_38);
  return;
}

Assistant:

AttributeExtract::AttributeExtract(SnapshotProcessFn snap_fn) : mP { new AttributeExtractImpl(snap_fn) }
{}